

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Cnf_AddCardinConstrGeneral(sat_solver *p,Vec_Int_t *vVars,int K,int fStrict)

{
  Vec_Int_t *vVars_00;
  int iVar2;
  int iVar3;
  uint k;
  int iVar4;
  int iVar1;
  uint iVar1_00;
  undefined4 extraout_var;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int Level;
  ulong uVar8;
  ulong uVar9;
  int Lit;
  ulong local_68;
  int local_5c;
  int local_58;
  int local_54;
  uint local_50;
  int local_4c;
  Vec_Int_t *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar5 = (ulong)(uint)fStrict;
  local_5c = fStrict;
  local_58 = K;
  iVar2 = sat_solver_nvars(p);
  local_68 = CONCAT44(extraout_var,iVar2);
  uVar7 = vVars->nSize;
  uVar8 = (ulong)uVar7;
  iVar6 = 0;
  while (iVar6 < vVars->nSize) {
    iVar3 = Vec_IntEntry(vVars,iVar6);
    if ((iVar3 < 0) || (iVar6 = iVar6 + 1, iVar2 <= iVar3)) {
      __assert_fail("iVar >= 0 && iVar < nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0xad,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
    }
  }
  sat_solver_setnvars(p,uVar7 * uVar7 + iVar2);
  k = uVar7 - 1;
  uVar9 = 0;
  local_54 = iVar2;
  local_50 = 0;
  local_48 = vVars;
  local_38 = uVar8;
  if (0 < (int)uVar7) {
    local_50 = uVar7;
  }
  while( true ) {
    uVar7 = (uint)uVar9;
    iVar6 = (int)uVar8;
    if (uVar7 == local_50) break;
    iVar3 = (uVar7 - 1) * iVar6 + iVar2;
    iVar2 = uVar7 * iVar6 + iVar2;
    uVar7 = uVar7 & 1;
    local_40 = uVar9;
    if ((uVar9 & 1) != 0) {
      sat_solver_add_buffer(p,iVar2,iVar3,(int)uVar5);
    }
    while( true ) {
      local_4c = iVar2;
      vVars_00 = local_48;
      iVar2 = local_54;
      iVar6 = uVar7 + 1;
      Level = (int)local_40;
      if ((int)uVar8 <= iVar6) break;
      iVar2 = (int)local_68;
      iVar4 = Cnf_AddCardinVar(Level,iVar3,local_48,uVar7);
      iVar1 = Cnf_AddCardinVar(Level,iVar3,vVars_00,iVar6);
      sat_solver_add_and(p,iVar2 + uVar7,iVar4,iVar1,1,1,1);
      iVar2 = (int)local_68;
      iVar4 = Cnf_AddCardinVar(Level,iVar3,vVars_00,uVar7);
      iVar1_00 = Cnf_AddCardinVar(Level,iVar3,vVars_00,iVar6);
      uVar8 = local_38;
      uVar5 = (ulong)iVar1_00;
      sat_solver_add_and(p,iVar2 + uVar7 + 1,iVar4,iVar1_00,0,0,0);
      uVar7 = uVar7 + 2;
      iVar2 = local_4c;
    }
    if (k == uVar7) {
      uVar5 = (ulong)k;
      iVar4 = local_4c + k;
      iVar6 = Cnf_AddCardinVar(Level,iVar3,local_48,k);
      sat_solver_add_buffer(p,iVar4,iVar6,(int)uVar5);
    }
    uVar9 = (ulong)(Level + 1);
    local_68 = (ulong)(uint)((int)local_68 + (int)uVar8);
  }
  if ((0 < local_58) && (local_58 < iVar6)) {
    iVar6 = iVar2 + local_58 + k * iVar6;
    Lit = Abc_Var2Lit(iVar6,1);
    iVar2 = sat_solver_addclause(p,&Lit,(lit *)&local_68);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0xc1,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
    }
    if (local_5c != 0) {
      Lit = Abc_Var2Lit(iVar6 + -1,0);
      iVar2 = sat_solver_addclause(p,&Lit,(lit *)&local_68);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                      ,0xc6,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
      }
    }
    return;
  }
  __assert_fail("K > 0 && K < nBits",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,0xbe,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
}

Assistant:

void Cnf_AddCardinConstrGeneral( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict )
{
    int i, k, iCur, iNext, iVar, Lit;
    int nVars = sat_solver_nvars(p);
    int nBits = Vec_IntSize(vVars);
    Vec_IntForEachEntry( vVars, iVar, i )
        assert( iVar >= 0 && iVar < nVars );
    sat_solver_setnvars( p, nVars + nBits * nBits );
    for ( i = 0; i < nBits; i++ )
    {
        iCur = nVars + nBits * (i-1);
        iNext = nVars + nBits * i;
        if ( i & 1 )
            sat_solver_add_buffer( p, iNext, Cnf_AddCardinVar(i, iCur, vVars, 0), 0 );
        for ( k = i & 1; k + 1 < nBits; k += 2 )
        {
            sat_solver_add_and( p, iNext+k  , Cnf_AddCardinVar(i, iCur, vVars, k), Cnf_AddCardinVar(i, iCur, vVars, k+1), 1, 1, 1 );
            sat_solver_add_and( p, iNext+k+1, Cnf_AddCardinVar(i, iCur, vVars, k), Cnf_AddCardinVar(i, iCur, vVars, k+1), 0, 0, 0 );
        }
        if ( k == nBits - 1 )
            sat_solver_add_buffer( p, iNext + nBits-1, Cnf_AddCardinVar(i, iCur, vVars, nBits-1), 0 );
    }
    // add final constraint
    assert( K > 0 && K < nBits );
    Lit = Abc_Var2Lit( nVars + nBits * (nBits - 1) + K, 1 );
    if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
        assert( 0 );
    if ( fStrict )
    {
        Lit = Abc_Var2Lit( nVars + nBits * (nBits - 1) + K - 1, 0 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
}